

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult * __thiscall
Catch::clara::detail::ExeName::set
          (ParserResult *__return_storage_ptr__,ExeName *this,string *newName)

{
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  ParseResultType local_5c [5];
  string local_48 [8];
  string filename;
  size_type lastSlash;
  string *newName_local;
  ExeName *this_local;
  
  filename.field_2._8_8_ = ::std::__cxx11::string::find_last_of((char *)newName,0x5097a8);
  if (filename.field_2._8_8_ == -1) {
    ::std::__cxx11::string::string(local_48,(string *)newName);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_48,(ulong)newName);
  }
  this_00 = std::
            __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_name);
  ::std::__cxx11::string::operator=((string *)this_00,local_48);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_ref);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_ref);
    (*(peVar2->super_BoundRef)._vptr_BoundRef[4])(__return_storage_ptr__,peVar2,local_48);
  }
  else {
    local_5c[0] = Matched;
    BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
              (__return_storage_ptr__,local_5c);
  }
  local_5c[1] = 1;
  ::std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

auto set( std::string const& newName ) -> ParserResult {

            auto lastSlash = newName.find_last_of( "\\/" );
            auto filename = ( lastSlash == std::string::npos )
                    ? newName
                    : newName.substr( lastSlash+1 );

            *m_name = filename;
            if( m_ref )
                return m_ref->setValue( filename );
            else
                return ParserResult::ok( ParseResultType::Matched );
        }